

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O1

char * choc::text::FloatToStringBuffer<float>::writeWithoutExponentLessThan1
                 (char *dest,uint32_t length,int mantissaDigits,int maxDecimalPlaces)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar2 = (char *)CONCAT44(in_register_0000000c,maxDecimalPlaces);
  uVar4 = -(mantissaDigits + -2);
  memmove(dest + uVar4,dest,(ulong)length);
  if (mantissaDigits != 2) {
    memset(dest,0x30,(ulong)uVar4);
  }
  dest[1] = '.';
  if (mantissaDigits + maxDecimalPlaces < (int)length) {
    bVar1 = maxDecimalPlaces < 2;
    if (1 < maxDecimalPlaces) {
      pcVar2 = (char *)(ulong)(uint)maxDecimalPlaces;
      if ((dest + 1)[(long)pcVar2] == '0') {
        do {
          bVar1 = (int)(maxDecimalPlaces + 1U) < 4;
          if (SBORROW4(maxDecimalPlaces + 1U,4) != (int)(maxDecimalPlaces - 3U) < 0)
          goto LAB_001d0362;
          pcVar2 = (char *)(ulong)(uint)maxDecimalPlaces;
          maxDecimalPlaces = maxDecimalPlaces - 1;
        } while (dest[(long)pcVar2] == '0');
      }
      else {
        pcVar2 = pcVar2 + 1;
      }
      pcVar2 = pcVar2 + (long)dest + 1;
    }
LAB_001d0362:
    pcVar3 = dest + 3;
    if (!bVar1) {
      pcVar3 = pcVar2;
    }
  }
  else {
    uVar5 = (ulong)(uVar4 + length);
    do {
      uVar6 = uVar5 - 1;
      if (uVar5 < 4) break;
      uVar5 = uVar6;
    } while (dest[uVar6 & 0xffffffff] == '0');
    pcVar3 = dest + ((int)uVar6 + 1);
  }
  return pcVar3;
}

Assistant:

static char* writeWithoutExponentLessThan1 (char* dest, uint32_t length, int mantissaDigits, int maxDecimalPlaces)
    {
        auto numPaddingZeros = static_cast<uint32_t> (2 - mantissaDigits);
        insertChar (dest, length, '0', numPaddingZeros);
        dest[1] = '.';

        if (static_cast<int> (length) > maxDecimalPlaces + mantissaDigits)
        {
            for (int i = maxDecimalPlaces + 1; i > 2; --i)
                if (dest[i] != '0')
                    return dest + (i + 1);

            return dest + 3;
        }

        length += numPaddingZeros;

        while (dest[length - 1] == '0' && length > 3)
            --length;

        return dest + length;
    }